

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O1

bool __thiscall
FirewirePort::WriteQuadletNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t data,uchar param_4)

{
  int iVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000081;
  ushort uVar3;
  bool bVar4;
  quadlet_t local_54;
  long *local_50 [2];
  long local_40 [2];
  
  local_54 = data;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"FirewirePort::WriteQuadlet","",CONCAT44(in_register_0000000c,data),
             CONCAT71(in_register_00000081,param_4));
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((char)iVar1 == '\0') {
    bVar4 = false;
  }
  else {
    local_54 = local_54 >> 0x18 | (local_54 & 0xff0000) >> 8 | (local_54 & 0xff00) << 8 |
               local_54 << 0x18;
    iVar1 = raw1394_write(this->handle,this->baseNodeId + node,addr,4);
    bVar4 = iVar1 == 0;
    if (node == 0x3f && !bVar4) {
      if ((this->super_BasePort).NumOfNodes_ == 0) {
        bVar4 = true;
      }
      else {
        bVar4 = true;
        uVar3 = 1;
        do {
          iVar1 = raw1394_write(this->handle,this->baseNodeId + uVar3 + -1,addr,4,&local_54);
          if (iVar1 != 0) {
            bVar4 = false;
          }
          uVar2 = (uint)uVar3;
          uVar3 = uVar3 + 1;
        } while (uVar2 < (this->super_BasePort).NumOfNodes_);
      }
    }
  }
  return bVar4;
}

Assistant:

bool FirewirePort::WriteQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::WriteQuadlet"))
        return false;

    data = bswap_32(data);
    bool ret = !raw1394_write(handle, baseNodeId+node, addr, 4, &data);

    // Workaround for Firewire broadcast, which is not currently working due to an issue with
    // either libraw1394 or the Firewire JuJu driver.
    if (!ret && (node == FW_NODE_BROADCAST)) {
        ret = true;
        for (nodeid_t curNode = 0; curNode < NumOfNodes_; curNode++) {
            if (raw1394_write(handle, baseNodeId+curNode, addr, 4, &data))
                ret = false;
        }
    }

    return ret;
}